

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Segment::CheckHeaderInfo(Segment *this)

{
  Track **ppTVar1;
  bool bVar2;
  uint64_t uVar3;
  ulong uVar4;
  Track *pTVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  
  if (this->header_written_ != false) {
    return true;
  }
  bVar2 = WriteSegmentHeader(this);
  if (bVar2) {
    uVar3 = MaxOffset(this);
    if ((this->seek_head_).seek_entry_id_[0] == 0) {
      bVar2 = true;
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      do {
        uVar6 = uVar4;
        bVar2 = uVar6 < 4;
        if (uVar6 == 4) goto LAB_001207d1;
        uVar4 = uVar6 + 1;
      } while ((this->seek_head_).seek_entry_id_[uVar6 + 1] != 0);
      bVar2 = uVar6 < 4;
    }
    (this->seek_head_).seek_entry_id_[uVar4] = 0x1f43b675;
    (this->seek_head_).seek_entry_pos_[uVar4] = uVar3;
LAB_001207d1:
    if (bVar2) {
      if (this->output_cues_ != true) {
        return true;
      }
      if (this->cues_track_ != 0) {
        return true;
      }
      uVar4 = (ulong)(this->tracks_).track_entries_size_;
      if (uVar4 == 0) {
        bVar2 = true;
      }
      else {
        ppTVar1 = (this->tracks_).track_entries_;
        uVar6 = 0;
        do {
          if (ppTVar1 == (Track **)0x0) {
            pTVar5 = (Track *)0x0;
          }
          else {
            pTVar5 = ppTVar1[uVar6];
          }
          if (pTVar5 == (Track *)0x0) {
            iVar7 = 1;
LAB_00120856:
            bVar2 = false;
          }
          else {
            uVar3 = pTVar5->number_;
            pTVar5 = *ppTVar1;
            if (pTVar5->number_ != uVar3) {
              lVar8 = 1;
              do {
                pTVar5 = ppTVar1[lVar8];
                lVar8 = lVar8 + 1;
              } while (pTVar5->number_ != uVar3);
            }
            if (pTVar5->type_ == 1) {
              this->cues_track_ = uVar3;
              iVar7 = 2;
              goto LAB_00120856;
            }
            iVar7 = 0;
            bVar2 = true;
          }
          if (!bVar2) goto LAB_00120871;
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar4);
        iVar7 = 2;
LAB_00120871:
        bVar2 = iVar7 == 2;
      }
      if (bVar2) {
        if (this->cues_track_ != 0) {
          return true;
        }
        ppTVar1 = (this->tracks_).track_entries_;
        pTVar5 = (Track *)0x0;
        if ((ppTVar1 != (Track **)0x0) && ((this->tracks_).track_entries_size_ != 0)) {
          pTVar5 = *ppTVar1;
        }
        if (pTVar5 != (Track *)0x0) {
          this->cues_track_ = pTVar5->number_;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Segment::CheckHeaderInfo() {
  if (!header_written_) {
    if (!WriteSegmentHeader())
      return false;

    if (!seek_head_.AddSeekEntry(libwebm::kMkvCluster, MaxOffset()))
      return false;

    if (output_cues_ && cues_track_ == 0) {
      // Check for a video track
      for (uint32_t i = 0; i < tracks_.track_entries_size(); ++i) {
        const Track* const track = tracks_.GetTrackByIndex(i);
        if (!track)
          return false;

        if (tracks_.TrackIsVideo(track->number())) {
          cues_track_ = track->number();
          break;
        }
      }

      // Set first track found
      if (cues_track_ == 0) {
        const Track* const track = tracks_.GetTrackByIndex(0);
        if (!track)
          return false;

        cues_track_ = track->number();
      }
    }
  }
  return true;
}